

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationDiscrete.cpp
# Opt level: O1

void __thiscall
JointObservationDiscrete::AddIndividualObservation
          (JointObservationDiscrete *this,ObservationDiscrete *a,Index agentI)

{
  pointer *pppOVar1;
  iterator __position;
  iterator __position_00;
  ostream *poVar2;
  ObservationDiscrete *local_28;
  Index local_1c;
  
  local_28 = a;
  if ((long)(this->_m_opVector).
            super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_opVector).
            super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)agentI) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="
               ,0x65);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - agentI=",10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  __position._M_current =
       (this->_m_opVector).
       super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_m_opVector).
      super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ObservationDiscrete_const*,std::allocator<ObservationDiscrete_const*>>::
    _M_realloc_insert<ObservationDiscrete_const*const&>
              ((vector<ObservationDiscrete_const*,std::allocator<ObservationDiscrete_const*>> *)
               &this->_m_opVector,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppOVar1 = &(this->_m_opVector).
                super__Vector_base<const_ObservationDiscrete_*,_std::allocator<const_ObservationDiscrete_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppOVar1 = *pppOVar1 + 1;
  }
  local_1c = (local_28->super_DiscreteEntity)._m_index;
  __position_00._M_current =
       (this->_m_oIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->_m_oIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->_m_oIndexVector,__position_00,&local_1c);
  }
  else {
    *__position_00._M_current = local_1c;
    (this->_m_oIndexVector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void JointObservationDiscrete::AddIndividualObservation(const ObservationDiscrete* a,  Index agentI)
{
    if (agentI != _m_opVector.size() )
    cout << "WARNING! AddIndividualAction: size of _m_opVector does not match index of agent!\n _m_opVector.size()="<< _m_opVector.size()<<" - agentI="<<agentI<<endl;    
    _m_opVector.push_back(a);
    _m_oIndexVector.push_back(a->GetIndex());
}